

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O1

SUNErrCode SUNMatScaleAdd_Band(sunrealtype c,SUNMatrix A,SUNMatrix B)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  SUNMatrix A_00;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  pvVar1 = B->content;
  lVar11 = *(long *)((long)pvVar1 + 0x18);
  pvVar2 = A->content;
  lVar8 = *(long *)((long)pvVar2 + 0x18);
  if ((lVar8 < lVar11) ||
     (lVar3 = *(long *)((long)pvVar1 + 0x20), *(long *)((long)pvVar2 + 0x20) < lVar3)) {
    lVar3 = *(long *)((long)pvVar2 + 8);
    lVar9 = *(long *)((long)pvVar1 + 0x20);
    if (*(long *)((long)pvVar1 + 0x20) < *(long *)((long)pvVar2 + 0x20)) {
      lVar9 = *(long *)((long)pvVar2 + 0x20);
    }
    if (lVar11 < lVar8) {
      lVar11 = lVar8;
    }
    lVar8 = lVar3 + -1;
    if (lVar9 + lVar11 < lVar3) {
      lVar8 = lVar9 + lVar11;
    }
    A_00 = SUNBandMatrixStorage(lVar3,lVar11,lVar9,lVar8,A->sunctx);
    pvVar1 = A->content;
    lVar11 = *(long *)((long)pvVar1 + 8);
    if (0 < lVar11) {
      lVar8 = *(long *)((long)pvVar1 + 0x40);
      lVar3 = *(long *)((long)pvVar1 + 0x20);
      lVar9 = *(long *)((long)pvVar1 + 0x28);
      lVar4 = *(long *)((long)A_00->content + 0x28);
      lVar5 = *(long *)((long)A_00->content + 0x40);
      lVar6 = *(long *)((long)pvVar1 + 0x18);
      lVar13 = 0;
      do {
        if (-lVar6 <= lVar3) {
          lVar7 = *(long *)(lVar8 + lVar13 * 8);
          lVar10 = *(long *)(lVar5 + lVar13 * 8);
          lVar12 = -lVar6;
          do {
            *(double *)(lVar10 + lVar4 * 8 + lVar12 * 8) =
                 *(double *)(lVar7 + lVar9 * 8 + lVar12 * 8) * c;
            lVar12 = lVar12 + 1;
          } while (lVar3 + 1 != lVar12);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar11);
    }
    pvVar2 = B->content;
    lVar11 = *(long *)((long)pvVar2 + 8);
    if (0 < lVar11) {
      lVar8 = *(long *)((long)pvVar2 + 0x40);
      lVar3 = *(long *)((long)pvVar2 + 0x20);
      lVar9 = *(long *)((long)pvVar2 + 0x28);
      lVar4 = *(long *)((long)A_00->content + 0x28);
      lVar5 = *(long *)((long)A_00->content + 0x40);
      lVar6 = *(long *)((long)pvVar2 + 0x18);
      lVar13 = 0;
      do {
        if (-lVar6 <= lVar3) {
          lVar7 = *(long *)(lVar8 + lVar13 * 8);
          lVar12 = *(long *)(lVar5 + lVar13 * 8) + lVar4 * 8;
          lVar10 = -lVar6;
          do {
            *(double *)(lVar12 + lVar10 * 8) =
                 *(double *)(lVar7 + lVar9 * 8 + lVar10 * 8) + *(double *)(lVar12 + lVar10 * 8);
            lVar10 = lVar10 + 1;
          } while (lVar3 + 1 != lVar10);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar11);
    }
    free(*(void **)((long)pvVar1 + 0x30));
    pvVar1 = A->content;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    free(*(void **)((long)pvVar1 + 0x40));
    pvVar1 = A->content;
    *(undefined8 *)((long)pvVar1 + 0x40) = 0;
    free(pvVar1);
    A->content = (void *)0x0;
    A->content = A_00->content;
    A_00->content = (void *)0x0;
    SUNMatDestroy_Band(A_00);
  }
  else {
    lVar8 = *(long *)((long)pvVar2 + 8);
    if (0 < lVar8) {
      lVar9 = *(long *)((long)pvVar2 + 0x28);
      lVar4 = *(long *)((long)pvVar2 + 0x40);
      lVar5 = *(long *)((long)pvVar1 + 0x28);
      lVar6 = *(long *)((long)pvVar1 + 0x40);
      lVar13 = 0;
      do {
        if (SBORROW8(lVar3,-lVar11) == lVar3 + lVar11 < 0) {
          lVar12 = *(long *)(lVar4 + lVar13 * 8) + lVar9 * 8;
          lVar7 = *(long *)(lVar6 + lVar13 * 8);
          lVar10 = -lVar11;
          do {
            *(double *)(lVar12 + lVar10 * 8) =
                 *(double *)(lVar12 + lVar10 * 8) * c + *(double *)(lVar7 + lVar5 * 8 + lVar10 * 8);
            lVar10 = lVar10 + 1;
          } while (lVar3 + 1 != lVar10);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar8);
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAdd_Band(sunrealtype c, SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;
  sunrealtype *A_colj, *B_colj;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Call separate routine in B has larger bandwidth(s) than A */
  if ((SM_UBAND_B(B) > SM_UBAND_B(A)) || (SM_LBAND_B(B) > SM_LBAND_B(A)))
  {
    SUNCheckCall(SMScaleAddNew_Band(c, A, B));
    return SUN_SUCCESS;
  }

  /* Otherwise, perform operation in-place */
  for (j = 0; j < SM_COLUMNS_B(A); j++)
  {
    A_colj = SM_COLUMN_B(A, j);
    B_colj = SM_COLUMN_B(B, j);
    for (i = -SM_UBAND_B(B); i <= SM_LBAND_B(B); i++)
    {
      A_colj[i] = c * A_colj[i] + B_colj[i];
    }
  }
  return SUN_SUCCESS;
}